

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

uint portInfo(snd_seq_t *seq,snd_seq_port_info_t *pinfo,uint type,int portNumber)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  long lVar3;
  size_t __n;
  ulong uVar4;
  void *__s;
  char cVar5;
  undefined8 uStack_40;
  uint local_38;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  uStack_40 = 0x18d5c4;
  local_38 = type;
  lVar3 = snd_seq_client_info_sizeof();
  lVar3 = -(lVar3 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar3);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d5da;
  __n = snd_seq_client_info_sizeof();
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d5ea;
  memset(__s,0,__n);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d5f7;
  snd_seq_client_info_set_client(__s,0xffffffff);
  uVar2 = 0;
  do {
    do {
      do {
        *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d602;
        iVar1 = snd_seq_query_next_client(seq,__s);
        if (iVar1 < 0) {
          return portNumber >> 0x1f & uVar2;
        }
        *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d612;
        iVar1 = snd_seq_client_info_get_client(__s);
      } while (iVar1 == 0);
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d620;
      snd_seq_port_info_set_client(pinfo,iVar1);
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d62d;
      snd_seq_port_info_set_port(pinfo,0xffffffff);
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d638;
      iVar1 = snd_seq_query_next_port(seq,pinfo);
    } while (iVar1 < 0);
    do {
      local_34 = uVar2;
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d648;
      uVar4 = snd_seq_port_info_get_type(pinfo);
      cVar5 = '\x06';
      if ((uVar4 & 0x100402) != 0) {
        *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d65d;
        uVar2 = snd_seq_port_info_get_capability(pinfo);
        if ((local_38 & ~uVar2) == 0) {
          cVar5 = local_34 == portNumber;
          local_34 = local_34 + !(bool)cVar5;
        }
      }
      if ((cVar5 != '\x06') && (cVar5 != '\0')) {
        return 1;
      }
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18d690;
      iVar1 = snd_seq_query_next_port(seq,pinfo);
      uVar2 = local_34;
    } while (-1 < iVar1);
  } while( true );
}

Assistant:

unsigned int portInfo( snd_seq_t *seq, snd_seq_port_info_t *pinfo, unsigned int type, int portNumber )
{
  snd_seq_client_info_t *cinfo;
  int client;
  int count = 0;
  snd_seq_client_info_alloca( &cinfo );

  snd_seq_client_info_set_client( cinfo, -1 );
  while ( snd_seq_query_next_client( seq, cinfo ) >= 0 ) {
    client = snd_seq_client_info_get_client( cinfo );
    if ( client == 0 ) continue;
    // Reset query info
    snd_seq_port_info_set_client( pinfo, client );
    snd_seq_port_info_set_port( pinfo, -1 );
    while ( snd_seq_query_next_port( seq, pinfo ) >= 0 ) {
      unsigned int atyp = snd_seq_port_info_get_type( pinfo );
      if ( ( ( atyp & SND_SEQ_PORT_TYPE_MIDI_GENERIC ) == 0 ) &&
           ( ( atyp & SND_SEQ_PORT_TYPE_SYNTH ) == 0 ) &&
           ( ( atyp & SND_SEQ_PORT_TYPE_APPLICATION ) == 0 ) ) continue;

      unsigned int caps = snd_seq_port_info_get_capability( pinfo );
      if ( ( caps & type ) != type ) continue;
      if ( count == portNumber ) return 1;
      ++count;
    }
  }

  // If a negative portNumber was used, return the port count.
  if ( portNumber < 0 ) return count;
  return 0;
}